

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderEms.cpp
# Opt level: O2

HighsStatus __thiscall
FilereaderEms::writeModelToFile
          (FilereaderEms *this,HighsOptions *options,string *filename,HighsModel *model)

{
  double dVar1;
  uint uVar2;
  pointer pbVar3;
  ostream *poVar4;
  HighsInt i_2;
  ulong uVar5;
  HighsInt i;
  long lVar6;
  ulong uVar7;
  ofstream f;
  undefined8 auStack_220 [63];
  
  std::ofstream::ofstream(&f);
  std::ofstream::open((string *)&f,(_Ios_Openmode)filename);
  uVar2 = (model->lp_).a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(model->lp_).num_col_];
  poVar4 = std::operator<<((ostream *)&f,"n_rows");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = (ostream *)std::ostream::operator<<(&f,(model->lp_).num_row_);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&f,"n_columns");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = (ostream *)std::ostream::operator<<(&f,(model->lp_).num_col_);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&f,"n_matrix_elements");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = (ostream *)std::ostream::operator<<(&f,uVar2);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&f,"matrix");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (lVar6 = 0; lVar6 <= (model->lp_).num_col_; lVar6 = lVar6 + 1) {
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (&f,(model->lp_).a_matrix_.start_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar6]);
    std::operator<<(poVar4," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  uVar7 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar7;
  }
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (&f,(model->lp_).a_matrix_.index_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar7]);
    std::operator<<(poVar4," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  *(undefined8 *)((long)auStack_220 + *(long *)(_f + -0x18)) = 9;
  for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    poVar4 = std::ostream::_M_insert<double>
                       ((model->lp_).a_matrix_.value_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar7]);
    std::operator<<(poVar4," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  *(undefined8 *)((long)auStack_220 + *(long *)(_f + -0x18)) = 9;
  poVar4 = std::operator<<((ostream *)&f,"column_bounds");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (lVar6 = 0; lVar6 < (model->lp_).num_col_; lVar6 = lVar6 + 1) {
    poVar4 = std::ostream::_M_insert<double>
                       ((model->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar6]);
    std::operator<<(poVar4," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  for (lVar6 = 0; lVar6 < (model->lp_).num_col_; lVar6 = lVar6 + 1) {
    poVar4 = std::ostream::_M_insert<double>
                       ((model->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar6]);
    std::operator<<(poVar4," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  poVar4 = std::operator<<((ostream *)&f,"row_bounds");
  std::endl<char,std::char_traits<char>>(poVar4);
  *(undefined8 *)((long)auStack_220 + *(long *)(_f + -0x18)) = 9;
  for (lVar6 = 0; lVar6 < (model->lp_).num_row_; lVar6 = lVar6 + 1) {
    poVar4 = std::ostream::_M_insert<double>
                       ((model->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar6]);
    std::operator<<(poVar4," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  for (lVar6 = 0; lVar6 < (model->lp_).num_row_; lVar6 = lVar6 + 1) {
    poVar4 = std::ostream::_M_insert<double>
                       ((model->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar6]);
    std::operator<<(poVar4," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  poVar4 = std::operator<<((ostream *)&f,"column_costs");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (lVar6 = 0; lVar6 < (model->lp_).num_col_; lVar6 = lVar6 + 1) {
    poVar4 = std::ostream::_M_insert<double>
                       ((double)(model->lp_).sense_ *
                        (model->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar6]);
    std::operator<<(poVar4," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  if (((model->lp_).row_names_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       (model->lp_).row_names_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start) &&
     ((model->lp_).col_names_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (model->lp_).col_names_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    poVar4 = std::operator<<((ostream *)&f,"names");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&f,"columns");
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar6 = 0;
    for (uVar5 = 0;
        pbVar3 = (model->lp_).col_names_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(model->lp_).col_names_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5);
        uVar5 = uVar5 + 1) {
      poVar4 = std::operator<<((ostream *)&f,(string *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6));
      std::endl<char,std::char_traits<char>>(poVar4);
      lVar6 = lVar6 + 0x20;
    }
    poVar4 = std::operator<<((ostream *)&f,"rows");
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar6 = 0;
    for (uVar5 = 0;
        pbVar3 = (model->lp_).row_names_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(model->lp_).row_names_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5);
        uVar5 = uVar5 + 1) {
      poVar4 = std::operator<<((ostream *)&f,(string *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6));
      std::endl<char,std::char_traits<char>>(poVar4);
      lVar6 = lVar6 + 0x20;
    }
  }
  dVar1 = (model->lp_).offset_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    poVar4 = std::operator<<((ostream *)&f,"shift");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::ostream::_M_insert<double>((double)(model->lp_).sense_ * (model->lp_).offset_);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  std::ofstream::close();
  std::ofstream::~ofstream(&f);
  return kOk;
}

Assistant:

HighsStatus FilereaderEms::writeModelToFile(const HighsOptions& options,
                                            const std::string filename,
                                            const HighsModel& model) {
  std::ofstream f;
  f.open(filename, std::ios::out);
  const HighsLp& lp = model.lp_;
  HighsInt num_nz = lp.a_matrix_.start_[lp.num_col_];

  // counts
  f << "n_rows" << std::endl;
  f << lp.num_row_ << std::endl;
  f << "n_columns" << std::endl;
  f << lp.num_col_ << std::endl;
  f << "n_matrix_elements" << std::endl;
  f << num_nz << std::endl;

  // matrix
  f << "matrix" << std::endl;
  for (HighsInt i = 0; i < lp.num_col_ + 1; i++)
    f << lp.a_matrix_.start_[i] << " ";
  f << std::endl;

  for (HighsInt i = 0; i < num_nz; i++) f << lp.a_matrix_.index_[i] << " ";
  f << std::endl;

  f << std::setprecision(9);
  for (HighsInt i = 0; i < num_nz; i++) f << lp.a_matrix_.value_[i] << " ";
  f << std::endl;

  // cost and bounds
  f << std::setprecision(9);

  f << "column_bounds" << std::endl;
  for (HighsInt i = 0; i < lp.num_col_; i++) f << lp.col_lower_[i] << " ";
  f << std::endl;

  for (HighsInt i = 0; i < lp.num_col_; i++) f << lp.col_upper_[i] << " ";
  f << std::endl;

  f << "row_bounds" << std::endl;
  f << std::setprecision(9);
  for (HighsInt i = 0; i < lp.num_row_; i++) f << lp.row_lower_[i] << " ";
  f << std::endl;

  for (HighsInt i = 0; i < lp.num_row_; i++) f << lp.row_upper_[i] << " ";
  f << std::endl;

  f << "column_costs" << std::endl;
  for (HighsInt i = 0; i < lp.num_col_; i++)
    f << (HighsInt)lp.sense_ * lp.col_cost_[i] << " ";
  f << std::endl;

  if (lp.row_names_.size() > 0 && lp.col_names_.size() > 0) {
    f << "names" << std::endl;

    f << "columns" << std::endl;
    for (size_t i = 0; i < lp.col_names_.size(); i++)
      f << lp.col_names_[i] << std::endl;

    f << "rows" << std::endl;
    for (size_t i = 0; i < lp.row_names_.size(); i++)
      f << lp.row_names_[i] << std::endl;
  }

  // todo: integer variables.

  if (lp.offset_ != 0)
    f << "shift" << std::endl << (HighsInt)lp.sense_ * lp.offset_ << std::endl;

  f << std::endl;
  f.close();
  return HighsStatus::kOk;
}